

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixmlparser.c
# Opt level: O1

int Parser_isValidXmlName(char *name)

{
  size_t sVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  
  if (name == (char *)0x0) {
    __assert_fail("name != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/ixmlparser.c"
                  ,0xa95,"int Parser_isValidXmlName(const char *)");
  }
  sVar1 = strlen(name);
  iVar4 = 0;
  iVar3 = 0xce;
  do {
    iVar2 = (iVar4 + iVar3) / 2;
    if ((int)*name < (int)(uint)Letter[iVar2].l) {
      iVar3 = iVar2 + -1;
    }
    else {
      if ((int)*name <= (int)(uint)Letter[iVar2].h) {
        if (sVar1 < 2) {
          return 1;
        }
        sVar5 = 1;
        do {
          iVar3 = Parser_isNameChar((int)name[sVar5],1);
          if (iVar3 == 0) {
            return 0;
          }
          sVar5 = sVar5 + 1;
        } while (sVar1 != sVar5);
        return 1;
      }
      iVar4 = iVar2 + 1;
    }
  } while (iVar4 <= iVar3);
  return 1;
}

Assistant:

int Parser_isValidXmlName(const DOMString name)
{
	const char *pstr = NULL;
	size_t i = (size_t)0;
	size_t nameLen = (size_t)0;

	assert(name != NULL);

	nameLen = strlen(name);
	pstr = name;
	if (Parser_isNameChar((int)*pstr, 0)) {
		for (i = (size_t)1; i < nameLen; ++i) {
			if (Parser_isNameChar((int)*(pstr + i), 1) == 0) {
				/* illegal char */
				return 0;
			}
		}
	}

	return 1;
}